

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausCollectLatchClauses(Clu_Man_t *p,Fra_Sml_t *pSeq)

{
  Vec_Int_t *pVVar1;
  int Entry;
  int iVar2;
  int iVar3;
  lit lVar4;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj2_00;
  uint local_4c;
  uint local_48;
  int nCountImps;
  int nCountConst;
  int k;
  int i;
  int CostMax;
  uint *pSims2;
  uint *pSims1;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  Fra_Sml_t *pSeq_local;
  Clu_Man_t *p_local;
  
  local_4c = 0;
  local_48 = 0;
  Entry = p->nSimWords << 5;
  pSeq->nWordsPref = p->nSimWordsPref;
  iVar2 = Aig_ManCiNum(p->pAig);
  iVar3 = Aig_ManRegNum(p->pAig);
  for (nCountConst = iVar2 - iVar3; iVar2 = Vec_PtrSize(p->pAig->vCis), nCountConst < iVar2;
      nCountConst = nCountConst + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,nCountConst);
    Fra_ObjSim(pSeq,pObj->Id);
    iVar2 = Fra_ClausSmlNodeIsConst(pSeq,pObj);
    if (iVar2 == 0) {
      iVar2 = Aig_ManCiNum(p->pAig);
      iVar3 = Aig_ManRegNum(p->pAig);
      for (nCountImps = iVar2 - iVar3; iVar2 = Vec_PtrSize(p->pAig->vCis), nCountImps < iVar2;
          nCountImps = nCountImps + 1) {
        pObj2_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,nCountImps);
        Fra_ObjSim(pSeq,pObj2_00->Id);
        iVar2 = Fra_ClausSmlNodesAreImp(pSeq,pObj,pObj2_00);
        if (iVar2 == 0) {
          iVar2 = Fra_ClausSmlNodesAreImp(pSeq,pObj2_00,pObj);
          if (iVar2 == 0) {
            iVar2 = Fra_ClausSmlNodesAreImpC(pSeq,pObj,pObj2_00);
            if (iVar2 != 0) {
              pVVar1 = p->vLits;
              lVar4 = toLitCond(p->pCnf->pVarNums[pObj->Id],1);
              Vec_IntPush(pVVar1,lVar4);
              pVVar1 = p->vLits;
              lVar4 = toLitCond(p->pCnf->pVarNums[pObj2_00->Id],1);
              Vec_IntPush(pVVar1,lVar4);
              pVVar1 = p->vClauses;
              iVar2 = Vec_IntSize(p->vLits);
              Vec_IntPush(pVVar1,iVar2);
              Vec_IntPush(p->vCosts,Entry);
              local_4c = local_4c + 1;
            }
          }
          else {
            pVVar1 = p->vLits;
            lVar4 = toLitCond(p->pCnf->pVarNums[pObj2_00->Id],1);
            Vec_IntPush(pVVar1,lVar4);
            pVVar1 = p->vLits;
            lVar4 = toLitCond(p->pCnf->pVarNums[pObj->Id],0);
            Vec_IntPush(pVVar1,lVar4);
            pVVar1 = p->vClauses;
            iVar2 = Vec_IntSize(p->vLits);
            Vec_IntPush(pVVar1,iVar2);
            Vec_IntPush(p->vCosts,Entry);
            local_4c = local_4c + 1;
          }
        }
        else {
          pVVar1 = p->vLits;
          lVar4 = toLitCond(p->pCnf->pVarNums[pObj->Id],1);
          Vec_IntPush(pVVar1,lVar4);
          pVVar1 = p->vLits;
          lVar4 = toLitCond(p->pCnf->pVarNums[pObj2_00->Id],0);
          Vec_IntPush(pVVar1,lVar4);
          pVVar1 = p->vClauses;
          iVar2 = Vec_IntSize(p->vLits);
          Vec_IntPush(pVVar1,iVar2);
          Vec_IntPush(p->vCosts,Entry);
          local_4c = local_4c + 1;
        }
      }
      if (p->nClausesMax / 2 < (int)(local_48 + local_4c)) break;
    }
    else {
      pVVar1 = p->vLits;
      lVar4 = toLitCond(p->pCnf->pVarNums[pObj->Id],1);
      Vec_IntPush(pVVar1,lVar4);
      pVVar1 = p->vClauses;
      iVar2 = Vec_IntSize(p->vLits);
      Vec_IntPush(pVVar1,iVar2);
      Vec_IntPush(p->vCosts,Entry);
      local_48 = local_48 + 1;
    }
  }
  pSeq->nWordsPref = 0;
  if (p->fVerbose != 0) {
    printf("Collected %d register constants and %d one-hotness implications.\n",(ulong)local_48,
           (ulong)local_4c);
  }
  p->nOneHots = local_48 + local_4c;
  p->nOneHotsProven = 0;
  return 0;
}

Assistant:

int Fra_ClausCollectLatchClauses( Clu_Man_t * p, Fra_Sml_t * pSeq )
{
    Aig_Obj_t * pObj1, * pObj2;
    unsigned * pSims1, * pSims2;
    int CostMax, i, k, nCountConst, nCountImps;

    nCountConst = nCountImps = 0;
    CostMax = p->nSimWords * 32;
/*
    // add the property
    {
        Aig_Obj_t * pObj;
        int Lits[1];
        pObj = Aig_ManCo( p->pAig, 0 );
        Lits[0] = toLitCond( p->pCnf->pVarNums[pObj->Id], 1 ); 
        Vec_IntPush( p->vLits, Lits[0] );
        Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
        Vec_IntPush( p->vCosts, CostMax );
        nCountConst++;
//        printf( "Added the target property to the set of clauses to be inductively checked.\n" );
    }
*/

    pSeq->nWordsPref = p->nSimWordsPref;
    Aig_ManForEachLoSeq( p->pAig, pObj1, i )
    {
        pSims1 = Fra_ObjSim( pSeq, pObj1->Id );
        if ( Fra_ClausSmlNodeIsConst( pSeq, pObj1 ) )
        {
            Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
            Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
            Vec_IntPush( p->vCosts, CostMax );
            nCountConst++;
            continue;
        }
        Aig_ManForEachLoSeq( p->pAig, pObj2, k )
        {
            pSims2 = Fra_ObjSim( pSeq, pObj2->Id );
            if ( Fra_ClausSmlNodesAreImp( pSeq, pObj1, pObj2 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 0 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
            if ( Fra_ClausSmlNodesAreImp( pSeq, pObj2, pObj1 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 0 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
            if ( Fra_ClausSmlNodesAreImpC( pSeq, pObj1, pObj2 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
        }
        if ( nCountConst + nCountImps > p->nClausesMax / 2 )
            break;
    }
    pSeq->nWordsPref = 0;
    if ( p->fVerbose )
    printf( "Collected %d register constants and %d one-hotness implications.\n", nCountConst, nCountImps );
    p->nOneHots = nCountConst + nCountImps;
    p->nOneHotsProven = 0;
    return 0;
}